

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O3

void __thiscall
qpdf::Stream::replaceStreamData
          (Stream *this,shared_ptr<QPDFObjectHandle::StreamDataProvider> *provider,
          QPDFObjectHandle *filter,QPDFObjectHandle *decode_parms)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Members *pMVar1;
  
  pMVar1 = stream(this);
  (pMVar1->stream_provider).
  super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (provider->
       super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pMVar1->stream_provider).
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(provider->
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  this_00 = (pMVar1->stream_data).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  (pMVar1->stream_data).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pMVar1->stream_data).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  replaceFilterData(this,filter,decode_parms,0);
  return;
}

Assistant:

void
Stream::replaceStreamData(
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> provider,
    QPDFObjectHandle const& filter,
    QPDFObjectHandle const& decode_parms)
{
    auto s = stream();
    s->stream_provider = provider;
    s->stream_data = nullptr;
    replaceFilterData(filter, decode_parms, 0);
}